

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O1

size_t compressImpl(Encoder *e,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,u8 *output,
                   size_t *lenOut,u8 **strOut,bool noSuffixOpt,bool avoidBranch,int simd)

{
  u8 *puVar1;
  bool bVar2;
  u16 uVar3;
  ushort uVar4;
  u16 uVar5;
  ushort uVar6;
  element_type *peVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  u8 *puVar12;
  size_t sVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong *puVar16;
  byte bVar17;
  ulong __n;
  size_t sVar18;
  size_t sVar19;
  uint uVar20;
  u8 *puVar21;
  ushort uStack_288;
  size_t sStack_268;
  ulong auStack_238 [65];
  
  peVar7 = (e->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = peVar7->nSymbols;
  uVar4 = peVar7->suffixLim;
  bVar2 = peVar7->zeroTerminated;
  uVar5 = peVar7->lenHisto[0];
  switchD_0105b559::default(auStack_238,0,0x207);
  if (nlines == 0) {
    sVar19 = 0;
  }
  else {
    uStack_288._0_1_ = (char)uVar5;
    bVar17 = (bVar2 + (char)uVar3) - (char)uStack_288;
    sVar18 = 0;
    puVar21 = output;
    do {
      strOut[sVar18] = puVar21;
      sVar19 = 0;
      do {
        sVar8 = lenIn[sVar18];
        __n = sVar8 - sVar19;
        if (0x1fe < __n) {
          __n = 0x1ff;
        }
        puVar1 = (u8 *)((__n & 0xffffffff) * 2 + 7);
        lVar11 = size - (long)puVar21;
        sVar13 = sVar18;
        if (output + lVar11 < puVar1) goto LAB_01c96548;
        switchD_015ff80e::default(auStack_238,strIn[sVar18] + sVar19,__n);
        puVar14 = (ulong *)((long)auStack_238 + __n);
        *(char *)puVar14 = (char)peVar7->terminator;
        uStack_288 = (ushort)bVar17;
        if (noSuffixOpt) {
          if (sVar8 != sVar19) {
            puVar16 = auStack_238;
            do {
              uVar9 = *puVar16;
              uVar6 = peVar7->shortCodes[uVar9 & 0xffff];
              if ((uVar6 & 0xff) < uVar4) {
                *puVar21 = (u8)uVar6;
                uVar15 = 2;
                puVar12 = puVar21 + 1;
              }
              else {
                uVar20 = ((uint)uVar9 & 0xffffff) * -0x4ee6db1f;
                uVar15 = (ulong)(((uVar20 >> 0xf ^ uVar20) & 0x3ff) << 4);
                uVar10 = *(ulong *)((long)&peVar7->hashTab[0].val + uVar15);
                uVar15 = *(ulong *)((long)&peVar7->hashTab[0].icl + uVar15);
                puVar21[1] = (u8)uVar9;
                puVar12 = puVar21 + 1;
                if ((uVar15 < 0xf1ff0000) &&
                   (uVar10 == (uVar9 << ((byte)uVar15 & 0x3f)) >> ((byte)uVar15 & 0x3f))) {
                  *puVar21 = (u8)(uVar15 >> 0x10);
                  uVar15 = uVar15 >> 0x1c;
                }
                else {
                  *puVar21 = (u8)uVar6;
                  uVar15 = 2;
                  if (uStack_288 <= (uVar6 & 0xff)) {
                    uVar15 = 1;
                    puVar12 = puVar21 + (ulong)((uVar6 >> 8 & 1) != 0) + 1;
                  }
                }
              }
              puVar21 = puVar12;
              puVar16 = (ulong *)((long)puVar16 + uVar15);
            } while (puVar16 < puVar14);
          }
        }
        else if (avoidBranch) {
          if (sVar8 != sVar19) {
            puVar16 = auStack_238;
            do {
              uVar9 = *puVar16;
              uVar6 = peVar7->shortCodes[uVar9 & 0xffff];
              uVar20 = ((uint)uVar9 & 0xffffff) * -0x4ee6db1f;
              uVar15 = (ulong)(((uVar20 >> 0xf ^ uVar20) & 0x3ff) << 4);
              uVar10 = *(ulong *)((long)&peVar7->hashTab[0].val + uVar15);
              uVar15 = *(ulong *)((long)&peVar7->hashTab[0].icl + uVar15);
              puVar21[1] = (u8)uVar9;
              if ((uVar15 < 0xf1ff0000) &&
                 (uVar10 == (uVar9 << ((byte)uVar15 & 0x3f)) >> ((byte)uVar15 & 0x3f))) {
                *puVar21 = (u8)(uVar15 >> 0x10);
                puVar21 = puVar21 + 1;
                uVar15 = uVar15 >> 0x1c;
              }
              else {
                *puVar21 = (u8)uVar6;
                puVar21 = puVar21 + (ulong)((uVar6 >> 8 & 1) != 0) + 1;
                uVar15 = (ulong)(uVar6 >> 0xc);
              }
              puVar16 = (ulong *)((long)puVar16 + uVar15);
            } while (puVar16 < puVar14);
          }
        }
        else if (sVar8 != sVar19) {
          puVar16 = auStack_238;
          do {
            uVar9 = *puVar16;
            uVar6 = peVar7->shortCodes[uVar9 & 0xffff];
            uVar20 = ((uint)uVar9 & 0xffffff) * -0x4ee6db1f;
            uVar15 = (ulong)(((uVar20 >> 0xf ^ uVar20) & 0x3ff) << 4);
            uVar10 = *(ulong *)((long)&peVar7->hashTab[0].val + uVar15);
            uVar15 = *(ulong *)((long)&peVar7->hashTab[0].icl + uVar15);
            puVar21[1] = (u8)uVar9;
            puVar12 = puVar21 + 1;
            if ((uVar15 < 0xf1ff0000) &&
               (uVar10 == (uVar9 << ((byte)uVar15 & 0x3f)) >> ((byte)uVar15 & 0x3f))) {
              *puVar21 = (u8)(uVar15 >> 0x10);
              uVar15 = uVar15 >> 0x1c;
            }
            else {
              *puVar21 = (u8)uVar6;
              uVar15 = 2;
              if (uStack_288 <= (uVar6 & 0xff)) {
                uVar15 = 1;
                puVar12 = puVar21 + (ulong)((uVar6 >> 8 & 1) != 0) + 1;
              }
            }
            puVar21 = puVar12;
            puVar16 = (ulong *)((long)puVar16 + uVar15);
          } while (puVar16 < puVar14);
        }
        sVar19 = sVar19 + __n;
      } while (sVar19 < lenIn[sVar18]);
      lenOut[sVar18] = (long)puVar21 - (long)strOut[sVar18];
      sVar13 = sStack_268;
LAB_01c96548:
      sStack_268 = sVar13;
      sVar19 = sStack_268;
    } while ((puVar1 <= output + lVar11) && (sVar18 = sVar18 + 1, sVar19 = nlines, sVar18 != nlines)
            );
  }
  return sVar19;
}

Assistant:

inline size_t _compressImpl(Encoder *e, size_t nlines, size_t lenIn[], u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[], bool noSuffixOpt, bool avoidBranch, int) {
	return compressBulk(*e->symbolTable, nlines, lenIn, strIn, size, output, lenOut, strOut, noSuffixOpt, avoidBranch);
}